

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * getrawtransaction(void)

{
  vector<RPCResult,_std::allocator<RPCResult>_> v1;
  string name;
  string name_00;
  string name_01;
  string cond;
  string m_key_name;
  string cond_00;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string cond_01;
  string name_02;
  string m_key_name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string m_key_name_09;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string m_key_name_10;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_15;
  string description_16;
  string description_17;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  RPCExamples examples;
  string description_18;
  string description_19;
  string description_20;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> results_00;
  undefined4 in_stack_ffffffffffffe398;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe39c;
  undefined1 in_stack_ffffffffffffe3a0 [16];
  undefined8 in_stack_ffffffffffffe3b0;
  undefined8 in_stack_ffffffffffffe3c0;
  undefined8 in_stack_ffffffffffffe3c8;
  undefined8 in_stack_ffffffffffffe3d0;
  _Manager_type in_stack_ffffffffffffe3d8;
  undefined8 in_stack_ffffffffffffe3e0;
  pointer in_stack_ffffffffffffe3e8;
  pointer in_stack_ffffffffffffe3f0;
  undefined1 in_stack_ffffffffffffe3f8 [16];
  pointer in_stack_ffffffffffffe408;
  undefined8 in_stack_ffffffffffffe410;
  pointer in_stack_ffffffffffffe418;
  pointer pRVar10;
  pointer in_stack_ffffffffffffe420;
  pointer pRVar11;
  pointer in_stack_ffffffffffffe428;
  pointer pRVar12;
  undefined8 in_stack_ffffffffffffe430;
  pointer in_stack_ffffffffffffe438;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe440;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe448;
  undefined8 in_stack_ffffffffffffe450;
  pointer in_stack_ffffffffffffe458;
  pointer in_stack_ffffffffffffe460;
  pointer in_stack_ffffffffffffe468;
  undefined1 in_stack_ffffffffffffe470 [16];
  allocator<char> local_1b6a;
  allocator<char> local_1b69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b68;
  allocator<char> local_1b4a;
  allocator<char> local_1b49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b48;
  allocator<char> local_1b2a;
  allocator<char> local_1b29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b28;
  allocator<char> local_1b0a;
  allocator<char> local_1b09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b08;
  allocator<char> local_1ae9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ae8;
  allocator<char> local_1aca;
  allocator<char> local_1ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ac8;
  allocator<char> local_1aac;
  allocator<char> local_1aab;
  allocator<char> local_1aaa;
  allocator<char> local_1aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1aa8;
  allocator_type local_1a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a88;
  allocator<char> local_1a6a;
  allocator<char> local_1a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a68;
  allocator<char> local_1a4a;
  allocator<char> local_1a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a48;
  allocator<char> local_1a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a28;
  allocator<char> local_1a0a;
  allocator<char> local_1a09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a08;
  allocator<char> local_19ea;
  allocator<char> local_19e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19e8;
  allocator<char> local_19c2;
  allocator<char> local_19c1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19c0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19a8;
  allocator<char> local_198b;
  allocator<char> local_198a;
  allocator<char> local_1989;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1988;
  allocator<char> local_1963;
  allocator<char> local_1962;
  allocator<char> local_1961;
  RPCResults local_1960;
  allocator_type local_1944;
  allocator<char> local_1943;
  allocator<char> local_1942;
  allocator<char> local_1941;
  int local_1940;
  allocator<char> local_193b;
  allocator<char> local_193a;
  allocator<char> local_1939;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1938;
  allocator<char> local_191a;
  allocator<char> local_1919;
  string local_1918;
  string local_18f8;
  string local_18d8;
  string local_18b8;
  string local_1898;
  string local_1878;
  string local_1858;
  string local_1838;
  string local_1818;
  string local_17f8;
  string local_17d8;
  string local_17b8;
  string local_1798;
  string local_1778;
  string local_1758;
  string local_1738;
  string local_1718;
  string local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  char *local_1638;
  size_type local_1630;
  char local_1628 [8];
  undefined8 uStack_1620;
  string local_1618 [32];
  string local_15f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d8;
  string local_15b8 [32];
  string local_1598 [32];
  string local_1578 [32];
  string local_1558 [32];
  string local_1538 [32];
  RPCResult local_1518 [4];
  string local_12f8 [32];
  string local_12d8 [32];
  string local_12b8 [32];
  string local_1298 [32];
  RPCResult local_1278 [2];
  string local_1168 [32];
  string local_1148 [32];
  RPCResult local_1128;
  string local_10a0 [32];
  string local_1080 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  RPCResult local_fc0 [3];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8;
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  RPCResult local_c28 [4];
  RPCResult local_a08;
  RPCResult local_980;
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  RPCResult local_838 [3];
  RPCArgOptions local_6a0;
  string local_658 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_638;
  undefined1 local_5e0;
  string local_5d8 [32];
  RPCArgOptions local_5b8;
  string local_570 [32];
  UniValue local_550;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  string local_498 [32];
  RPCArgOptions local_478;
  string local_430 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  string local_3b0 [32];
  RPCArg local_390 [3];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1040.field_2._M_allocated_capacity = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getrawtransaction",&local_1919);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "By default, this call only returns a transaction if it is in the mempool. If -txindex is enabled\nand no blockhash argument is passed, it will return the transaction if it is in the mempool or any block.\nIf a blockhash argument is passed, it will return the transaction if\nthe specified block is available and the transaction is in that block.\n\nHint: Use gettransaction for wallet transactions.\n\nIf verbosity is 0 or omitted, returns the serialized transaction as a hex-encoded string.\nIf verbosity is 1, returns a JSON Object with information about the transaction.\nIf verbosity is 2, returns a JSON Object with information about the transaction, including fee and prevout information."
             ,&local_191a);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"txid",&local_1939);
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_430,"The transaction id",&local_193a);
  local_478.oneline_description._M_dataplus._M_p = (pointer)&local_478.oneline_description.field_2;
  local_478.skip_type_check = false;
  local_478.oneline_description._M_string_length = 0;
  local_478.oneline_description.field_2._M_local_buf[0] = '\0';
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_478._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe398;
  name._8_16_ = in_stack_ffffffffffffe3a0;
  name.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe3c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe3c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe3d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe3e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe3f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe408;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe410;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffe420;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe418;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe428;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe430;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe440;
  opts._0_8_ = in_stack_ffffffffffffe438;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe448;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe450;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe458;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe460;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe468;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe470._0_8_;
  opts.hidden = (bool)in_stack_ffffffffffffe470[8];
  opts.also_positional = (bool)in_stack_ffffffffffffe470[9];
  opts._66_6_ = in_stack_ffffffffffffe470._10_6_;
  RPCArg::RPCArg(local_390,name,(Type)local_3b0,fallback,description_18,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"verbosity|verbose",&local_193b);
  local_1940 = 0;
  UniValue::UniValue<int,_int,_true>(&local_550,&local_1940);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_4f8,&local_550);
  std::__cxx11::string::string<std::allocator<char>>
            (local_570,
             "0 for hex-encoded data, 1 for a JSON object, and 2 for JSON object with fee and prevout"
             ,&local_1941);
  local_5b8.oneline_description._M_dataplus._M_p = (pointer)&local_5b8.oneline_description.field_2;
  local_5b8.skip_type_check = true;
  local_5b8.oneline_description._M_string_length = 0;
  local_5b8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_5b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_5b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_5b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_5b8._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe398;
  name_00._8_16_ = in_stack_ffffffffffffe3a0;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe3c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe3c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe3d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe3e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe3f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe408;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe410;
  description_19._M_string_length = (size_type)in_stack_ffffffffffffe420;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe418;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe428;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe430;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe440;
  opts_00._0_8_ = in_stack_ffffffffffffe438;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe448;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe450;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe458;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe460;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe468;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe470._0_8_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe470[8];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe470[9];
  opts_00._66_6_ = in_stack_ffffffffffffe470._10_6_;
  RPCArg::RPCArg(local_390 + 1,name_00,(Type)local_498,fallback_00,description_19,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"blockhash",&local_1942);
  local_638._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_5e0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"The block in which to look for the transaction",&local_1943);
  local_6a0.oneline_description._M_dataplus._M_p = (pointer)&local_6a0.oneline_description.field_2;
  local_6a0.skip_type_check = false;
  local_6a0.oneline_description._M_string_length = 0;
  local_6a0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6a0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6a0._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe398;
  name_01._8_16_ = in_stack_ffffffffffffe3a0;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe3c0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe3c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe3d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe3e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffe3f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe408;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe410;
  description_20._M_string_length = (size_type)in_stack_ffffffffffffe420;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe418;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe428;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe430;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe440;
  opts_01._0_8_ = in_stack_ffffffffffffe438;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe448;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe450;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe458;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe460;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe468;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe470._0_8_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe470[8];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe470[9];
  opts_01._66_6_ = in_stack_ffffffffffffe470._10_6_;
  RPCArg::RPCArg(local_390 + 2,name_01,(Type)local_5d8,fallback_01,description_20,opts_01);
  __l._M_len = 3;
  __l._M_array = local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1938,__l,&local_1944);
  std::__cxx11::string::string<std::allocator<char>>
            (local_858,"if verbosity is not set or set to 0",&local_1961);
  std::__cxx11::string::string<std::allocator<char>>(local_878,"data",&local_1962);
  std::__cxx11::string::string<std::allocator<char>>
            (local_898,"The serialized transaction as a hex-encoded string for \'txid\'",&local_1963
            );
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe398;
  cond._8_16_ = in_stack_ffffffffffffe3a0;
  cond.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe3c0;
  m_key_name_08._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  description_15._M_string_length = in_stack_ffffffffffffe3e0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3d8;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe3e8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe3f0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe408;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3f8._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3f8._8_8_;
  RPCResult::RPCResult(local_838,cond,(Type)local_858,m_key_name_08,description_15,inner_15);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b8,"if verbosity is set to 1",&local_1989);
  std::__cxx11::string::string<std::allocator<char>>(local_8d8,"",&local_198a);
  std::__cxx11::string::string<std::allocator<char>>(local_8f8,"",&local_198b);
  std::__cxx11::string::string<std::allocator<char>>(local_c48,"in_active_chain",&local_19c1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c68,
             "Whether specified block is in the active chain or not (only present with explicit \"blockhash\" argument)"
             ,&local_19c2);
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_16_ = in_stack_ffffffffffffe3a0;
  auVar1._0_4_ = in_stack_ffffffffffffe39c;
  auVar1._20_8_ = in_stack_ffffffffffffe3b0;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffe3c0;
  description._M_dataplus._M_p = (pointer)in_RDI;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_c28,BOOL,(string)(auVar1 << 0x20),SUB81(local_c48,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"blockhash",&local_19e9);
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"the block hash",&local_19ea);
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_16_ = in_stack_ffffffffffffe3a0;
  auVar2._0_4_ = in_stack_ffffffffffffe39c;
  auVar2._20_8_ = in_stack_ffffffffffffe3b0;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffe3c0;
  description_00._M_dataplus._M_p = (pointer)in_RDI;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_c28 + 1,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_c88,0),description_00,
             inner_00,true);
  std::__cxx11::string::string<std::allocator<char>>(local_cc8,"confirmations",&local_1a09);
  std::__cxx11::string::string<std::allocator<char>>(local_ce8,"The confirmations",&local_1a0a);
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_16_ = in_stack_ffffffffffffe3a0;
  auVar3._0_4_ = in_stack_ffffffffffffe39c;
  auVar3._20_8_ = in_stack_ffffffffffffe3b0;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffe3c0;
  description_01._M_dataplus._M_p = (pointer)in_RDI;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_c28 + 2,NUM,(string)(auVar3 << 0x20),SUB81(local_cc8,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"blocktime",&local_1a29);
  std::operator+(&local_d28,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_16_ = in_stack_ffffffffffffe3a0;
  auVar4._0_4_ = in_stack_ffffffffffffe39c;
  auVar4._20_8_ = in_stack_ffffffffffffe3b0;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffe3c0;
  description_02._M_dataplus._M_p = (pointer)in_RDI;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_c28 + 3,NUM_TIME,(string)(auVar4 << 0x20),SUB81(local_d08,0),description_02,
             inner_02,true);
  std::__cxx11::string::string<std::allocator<char>>(local_d48,"time",&local_1a49);
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"Same as \"blocktime\"",&local_1a4a);
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar5._4_16_ = in_stack_ffffffffffffe3a0;
  auVar5._0_4_ = in_stack_ffffffffffffe39c;
  auVar5._20_8_ = in_stack_ffffffffffffe3b0;
  auVar5._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffe3c0;
  description_03._M_dataplus._M_p = (pointer)in_RDI;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (&local_a08,NUM,(string)(auVar5 << 0x20),SUB81(local_d48,0),description_03,inner_03,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_d88,"hex",&local_1a69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_da8,"The serialized, hex-encoded data for \'txid\'",&local_1a6a);
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_04._M_string_length = in_stack_ffffffffffffe3c0;
  description_04._M_dataplus._M_p = (pointer)in_RDI;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(&local_980,STR_HEX,m_key_name,description_04,inner_04,SUB81(local_d88,0));
  __l_00._M_len = 6;
  __l_00._M_array = local_c28;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_19c0,__l_00,&local_1a89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"The transaction id (same as provided)",&local_1aa9);
  DecodeTxDoc(&local_1aa8,&local_dc8);
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = in_stack_ffffffffffffe39c;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = uVar9;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe3a0._0_8_;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe3a0._8_8_;
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>(&local_19a8,v1,&local_19c0);
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  cond_00._M_dataplus._M_p._0_4_ = uVar9;
  cond_00._8_16_ = in_stack_ffffffffffffe3a0;
  cond_00.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe3c0;
  m_key_name_09._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  description_16._M_string_length = in_stack_ffffffffffffe3e0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3d8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe3e8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe3f0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe408;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3f8._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3f8._8_8_;
  RPCResult::RPCResult(local_838 + 1,cond_00,(Type)local_8b8,m_key_name_09,description_16,inner_16);
  std::__cxx11::string::string<std::allocator<char>>(local_de8,"for verbosity = 2",&local_1aaa);
  std::__cxx11::string::string<std::allocator<char>>(local_e08,"",&local_1aab);
  std::__cxx11::string::string<std::allocator<char>>(local_e28,"",&local_1aac);
  std::__cxx11::string::string<std::allocator<char>>(local_fe0,"",&local_1ac9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1000,"Same output as verbosity = 1",&local_1aca);
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_05._M_string_length = in_stack_ffffffffffffe3c0;
  description_05._M_dataplus._M_p = (pointer)in_RDI;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_fc0,ELISION,m_key_name_00,description_05,inner_05,SUB81(local_fe0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1020,"fee",&local_1ae9);
  std::operator+(&local_1060,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_1040,&local_1060,", omitted if block undo data is not available");
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar6._4_16_ = in_stack_ffffffffffffe3a0;
  auVar6._0_4_ = in_stack_ffffffffffffe39c;
  auVar6._20_8_ = in_stack_ffffffffffffe3b0;
  auVar6._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe3c0;
  description_06._M_dataplus._M_p = (pointer)in_RDI;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_fc0 + 1,NUM,(string)(auVar6 << 0x20),SUB81(local_1020,0),description_06,inner_06,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1080,"vin",&local_1b09);
  std::__cxx11::string::string<std::allocator<char>>(local_10a0,"",&local_1b0a);
  std::__cxx11::string::string<std::allocator<char>>(local_1148,"",&local_1b29);
  std::__cxx11::string::string<std::allocator<char>>(local_1168,"utxo being spent",&local_1b2a);
  std::__cxx11::string::string<std::allocator<char>>(local_1298,"",&local_1b49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12b8,"Same output as verbosity = 1",&local_1b4a);
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_07._M_string_length = in_stack_ffffffffffffe3c0;
  description_07._M_dataplus._M_p = (pointer)in_RDI;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_1278,ELISION,m_key_name_01,description_07,inner_07,SUB81(local_1298,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_12d8,"prevout",&local_1b69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12f8,"The previous output, omitted if block undo data is not available",
             &local_1b6a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1538,"generated",(allocator<char> *)&stack0xffffffffffffe477);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1558,"Coinbase or not",(allocator<char> *)&stack0xffffffffffffe476);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_08._M_string_length = in_stack_ffffffffffffe3c0;
  description_08._M_dataplus._M_p = (pointer)in_RDI;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_1518,BOOL,m_key_name_02,description_08,inner_08,SUB81(local_1538,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1578,"height",(allocator<char> *)&stack0xffffffffffffe457);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1598,"The height of the prevout",(allocator<char> *)&stack0xffffffffffffe456);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_09._M_string_length = in_stack_ffffffffffffe3c0;
  description_09._M_dataplus._M_p = (pointer)in_RDI;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_1518 + 1,NUM,m_key_name_03,description_09,inner_09,SUB81(local_1578,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_15b8,"value",(allocator<char> *)&stack0xffffffffffffe437);
  std::operator+(&local_15d8,"The value in ",&CURRENCY_UNIT_abi_cxx11_);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_10._M_string_length = in_stack_ffffffffffffe3c0;
  description_10._M_dataplus._M_p = (pointer)in_RDI;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_1518 + 2,STR_AMOUNT,m_key_name_04,description_10,inner_10,SUB81(local_15b8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_15f8,"scriptPubKey",(allocator<char> *)&stack0xffffffffffffe417);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1618,"",(allocator<char> *)&stack0xffffffffffffe416);
  ScriptPubKeyDoc();
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_11._M_string_length = in_stack_ffffffffffffe3c0;
  description_11._M_dataplus._M_p = (pointer)in_RDI;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_1518 + 3,OBJ,m_key_name_05,description_11,inner_11,SUB81(local_15f8,0))
  ;
  __l_01._M_len = 4;
  __l_01._M_array = local_1518;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe478,__l_01,
             (allocator_type *)&stack0xffffffffffffe3f7);
  uVar9 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffe3a0;
  auVar7._0_4_ = in_stack_ffffffffffffe39c;
  auVar7._20_8_ = in_stack_ffffffffffffe3b0;
  auVar7._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe3c0;
  description_12._M_dataplus._M_p = (pointer)in_RDI;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult
            (local_1278 + 1,OBJ,(string)(auVar7 << 0x20),SUB81(local_12d8,0),description_12,inner_12
             ,true);
  __l_02._M_len = 2;
  __l_02._M_array = local_1278;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1b48,__l_02,(allocator_type *)&stack0xffffffffffffe3f6);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_13._M_string_length = in_stack_ffffffffffffe3c0;
  description_13._M_dataplus._M_p = (pointer)in_RDI;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(&local_1128,OBJ,m_key_name_06,description_13,inner_13,SUB81(local_1148,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_1128;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1b28,__l_03,(allocator_type *)&stack0xffffffffffffe3f5);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe3a0;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  description_14._M_string_length = in_stack_ffffffffffffe3c0;
  description_14._M_dataplus._M_p = (pointer)in_RDI;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3e0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3d8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffe3e8;
  RPCResult::RPCResult(local_fc0 + 2,ARR,m_key_name_07,description_14,inner_14,SUB81(local_1080,0));
  __l_04._M_len = 3;
  __l_04._M_array = local_fc0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1ac8,__l_04,(allocator_type *)&stack0xffffffffffffe3f4);
  cond_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe39c;
  cond_01._M_dataplus._M_p._0_4_ = uVar9;
  cond_01._8_16_ = in_stack_ffffffffffffe3a0;
  cond_01.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe3c0;
  m_key_name_10._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe3c8;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffe3d0;
  description_17._M_string_length = in_stack_ffffffffffffe3e0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3d8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe3e8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe3f0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe408;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3f8._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3f8._8_8_;
  RPCResult::RPCResult(local_838 + 2,cond_01,(Type)local_de8,m_key_name_10,description_17,inner_17);
  results_00._M_len = 3;
  results_00._M_array = local_838;
  RPCResults::RPCResults(&local_1960,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1718,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1738,"\"mytxid\"",(allocator<char> *)&stack0xffffffffffffe3f2);
  HelpExampleCli(&local_16f8,&local_1718,&local_1738);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1778,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1798,"\"mytxid\" 1",(allocator<char> *)&stack0xffffffffffffe3f0);
  HelpExampleCli(&local_1758,&local_1778,&local_1798);
  std::operator+(&local_16d8,&local_16f8,&local_1758);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17d8,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3ef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17f8,"\"mytxid\", 1",(allocator<char> *)&stack0xffffffffffffe3ee);
  HelpExampleRpc(&local_17b8,&local_17d8,&local_17f8);
  std::operator+(&local_16b8,&local_16d8,&local_17b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1838,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1858,"\"mytxid\" 0 \"myblockhash\"",
             (allocator<char> *)&stack0xffffffffffffe3ec);
  HelpExampleCli(&local_1818,&local_1838,&local_1858);
  std::operator+(&local_1698,&local_16b8,&local_1818);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1898,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3eb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18b8,"\"mytxid\" 1 \"myblockhash\"",
             (allocator<char> *)&stack0xffffffffffffe3ea);
  HelpExampleCli(&local_1878,&local_1898,&local_18b8);
  std::operator+(&local_1678,&local_1698,&local_1878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18f8,"getrawtransaction",(allocator<char> *)&stack0xffffffffffffe3e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1918,"\"mytxid\" 2 \"myblockhash\"",
             (allocator<char> *)&stack0xffffffffffffe3e8);
  HelpExampleCli(&local_18d8,&local_18f8,&local_1918);
  std::operator+(&local_1658,&local_1678,&local_18d8);
  local_1638 = local_1628;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1658._M_dataplus._M_p == &local_1658.field_2) {
    uStack_1620 = local_1658.field_2._8_8_;
  }
  else {
    local_1638 = local_1658._M_dataplus._M_p;
  }
  local_1630 = local_1658._M_string_length;
  local_1658._M_string_length = 0;
  local_1658.field_2._M_local_buf[0] = '\0';
  name_02._8_16_ = in_stack_ffffffffffffe3a0;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe3c8;
  name_02.field_2._8_8_ = in_stack_ffffffffffffe3b0;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:328:9)>
                  ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:328:9)>
                  ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe3e8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe3f8._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe3f8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_ffffffffffffe3f0;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe410;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar10;
  examples.m_examples.field_2._8_8_ = pRVar11;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe430;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar12;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar13;
  fun._M_invoker = (_Invoker_type)pRVar14;
  local_1658._M_dataplus._M_p = (pointer)&local_1658.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffe3c0,in_RDI)),args,
             results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe3c8);
  std::__cxx11::string::~string((string *)&local_1638);
  std::__cxx11::string::~string((string *)&local_1658);
  std::__cxx11::string::~string((string *)&local_18d8);
  std::__cxx11::string::~string((string *)&local_1918);
  std::__cxx11::string::~string((string *)&local_18f8);
  std::__cxx11::string::~string((string *)&local_1678);
  std::__cxx11::string::~string((string *)&local_1878);
  std::__cxx11::string::~string((string *)&local_18b8);
  std::__cxx11::string::~string((string *)&local_1898);
  std::__cxx11::string::~string((string *)&local_1698);
  std::__cxx11::string::~string((string *)&local_1818);
  std::__cxx11::string::~string((string *)&local_1858);
  std::__cxx11::string::~string((string *)&local_1838);
  std::__cxx11::string::~string((string *)&local_16b8);
  std::__cxx11::string::~string((string *)&local_17b8);
  std::__cxx11::string::~string((string *)&local_17f8);
  std::__cxx11::string::~string((string *)&local_17d8);
  std::__cxx11::string::~string((string *)&local_16d8);
  std::__cxx11::string::~string((string *)&local_1758);
  std::__cxx11::string::~string((string *)&local_1798);
  std::__cxx11::string::~string((string *)&local_1778);
  std::__cxx11::string::~string((string *)&local_16f8);
  std::__cxx11::string::~string((string *)&local_1738);
  std::__cxx11::string::~string((string *)&local_1718);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1960.m_results);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_838[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ac8);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_fc0[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b28);
  RPCResult::~RPCResult(&local_1128);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b48);
  lVar8 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1278[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe478);
  lVar8 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1518[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe3f8);
  std::__cxx11::string::~string(local_1618);
  std::__cxx11::string::~string(local_15f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe418);
  std::__cxx11::string::~string((string *)&local_15d8);
  std::__cxx11::string::~string(local_15b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe438);
  std::__cxx11::string::~string(local_1598);
  std::__cxx11::string::~string(local_1578);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe458);
  std::__cxx11::string::~string(local_1558);
  std::__cxx11::string::~string(local_1538);
  std::__cxx11::string::~string(local_12f8);
  std::__cxx11::string::~string(local_12d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b68);
  std::__cxx11::string::~string(local_12b8);
  std::__cxx11::string::~string(local_1298);
  std::__cxx11::string::~string(local_1168);
  std::__cxx11::string::~string(local_1148);
  std::__cxx11::string::~string(local_10a0);
  std::__cxx11::string::~string(local_1080);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b08);
  std::__cxx11::string::~string((string *)&local_1040);
  std::__cxx11::string::~string((string *)&local_1060);
  std::__cxx11::string::~string(local_1020);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ae8);
  std::__cxx11::string::~string(local_1000);
  std::__cxx11::string::~string(local_fe0);
  std::__cxx11::string::~string(local_e28);
  std::__cxx11::string::~string(local_e08);
  std::__cxx11::string::~string(local_de8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1aa8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19c0);
  lVar8 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_c28[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a88);
  std::__cxx11::string::~string(local_da8);
  std::__cxx11::string::~string(local_d88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a68);
  std::__cxx11::string::~string(local_d68);
  std::__cxx11::string::~string(local_d48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a48);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string(local_d08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a28);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a08);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19e8);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string(local_c48);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_8b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1988);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_858);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1938);
  lVar8 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_390[0].m_names._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_6a0);
  std::__cxx11::string::~string(local_658);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_638._M_first);
  std::__cxx11::string::~string(local_5d8);
  RPCArgOptions::~RPCArgOptions(&local_5b8);
  std::__cxx11::string::~string(local_570);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_4f8);
  UniValue::~UniValue(&local_550);
  std::__cxx11::string::~string(local_498);
  RPCArgOptions::~RPCArgOptions(&local_478);
  std::__cxx11::string::~string(local_430);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawtransaction()
{
    return RPCHelpMan{
                "getrawtransaction",

                "By default, this call only returns a transaction if it is in the mempool. If -txindex is enabled\n"
                "and no blockhash argument is passed, it will return the transaction if it is in the mempool or any block.\n"
                "If a blockhash argument is passed, it will return the transaction if\n"
                "the specified block is available and the transaction is in that block.\n\n"
                "Hint: Use gettransaction for wallet transactions.\n\n"

                "If verbosity is 0 or omitted, returns the serialized transaction as a hex-encoded string.\n"
                "If verbosity is 1, returns a JSON Object with information about the transaction.\n"
                "If verbosity is 2, returns a JSON Object with information about the transaction, including fee and prevout information.",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                    {"verbosity|verbose", RPCArg::Type::NUM, RPCArg::Default{0}, "0 for hex-encoded data, 1 for a JSON object, and 2 for JSON object with fee and prevout",
                     RPCArgOptions{.skip_type_check = true}},
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "The block in which to look for the transaction"},
                },
                {
                    RPCResult{"if verbosity is not set or set to 0",
                         RPCResult::Type::STR, "data", "The serialized transaction as a hex-encoded string for 'txid'"
                     },
                     RPCResult{"if verbosity is set to 1",
                         RPCResult::Type::OBJ, "", "",
                         Cat<std::vector<RPCResult>>(
                         {
                             {RPCResult::Type::BOOL, "in_active_chain", /*optional=*/true, "Whether specified block is in the active chain or not (only present with explicit \"blockhash\" argument)"},
                             {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "the block hash"},
                             {RPCResult::Type::NUM, "confirmations", /*optional=*/true, "The confirmations"},
                             {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME},
                             {RPCResult::Type::NUM, "time", /*optional=*/true, "Same as \"blocktime\""},
                             {RPCResult::Type::STR_HEX, "hex", "The serialized, hex-encoded data for 'txid'"},
                         },
                         DecodeTxDoc(/*txid_field_doc=*/"The transaction id (same as provided)")),
                    },
                    RPCResult{"for verbosity = 2",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                            {RPCResult::Type::NUM, "fee", /*optional=*/true, "transaction fee in " + CURRENCY_UNIT + ", omitted if block undo data is not available"},
                            {RPCResult::Type::ARR, "vin", "",
                            {
                                {RPCResult::Type::OBJ, "", "utxo being spent",
                                {
                                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                                    {RPCResult::Type::OBJ, "prevout", /*optional=*/true, "The previous output, omitted if block undo data is not available",
                                    {
                                        {RPCResult::Type::BOOL, "generated", "Coinbase or not"},
                                        {RPCResult::Type::NUM, "height", "The height of the prevout"},
                                        {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                                        {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
                                    }},
                                }},
                            }},
                        }},
                },
                RPCExamples{
                    HelpExampleCli("getrawtransaction", "\"mytxid\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1")
            + HelpExampleRpc("getrawtransaction", "\"mytxid\", 1")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 0 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 2 \"myblockhash\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);

    uint256 hash = ParseHashV(request.params[0], "parameter 1");
    const CBlockIndex* blockindex = nullptr;

    if (hash == chainman.GetParams().GenesisBlock().hashMerkleRoot) {
        // Special exception for the genesis block coinbase transaction
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "The genesis block coinbase is not considered an ordinary transaction and cannot be retrieved");
    }

    // Accept either a bool (true) or a num (>=0) to indicate verbosity.
    int verbosity{0};
    if (!request.params[1].isNull()) {
        if (request.params[1].isBool()) {
            verbosity = request.params[1].get_bool();
        } else {
            verbosity = request.params[1].getInt<int>();
        }
    }

    if (!request.params[2].isNull()) {
        LOCK(cs_main);

        uint256 blockhash = ParseHashV(request.params[2], "parameter 3");
        blockindex = chainman.m_blockman.LookupBlockIndex(blockhash);
        if (!blockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block hash not found");
        }
    }

    bool f_txindex_ready = false;
    if (g_txindex && !blockindex) {
        f_txindex_ready = g_txindex->BlockUntilSyncedToCurrentChain();
    }

    uint256 hash_block;
    const CTransactionRef tx = GetTransaction(blockindex, node.mempool.get(), hash, hash_block, chainman.m_blockman);
    if (!tx) {
        std::string errmsg;
        if (blockindex) {
            const bool block_has_data = WITH_LOCK(::cs_main, return blockindex->nStatus & BLOCK_HAVE_DATA);
            if (!block_has_data) {
                throw JSONRPCError(RPC_MISC_ERROR, "Block not available");
            }
            errmsg = "No such transaction found in the provided block";
        } else if (!g_txindex) {
            errmsg = "No such mempool transaction. Use -txindex or provide a block hash to enable blockchain transaction queries";
        } else if (!f_txindex_ready) {
            errmsg = "No such mempool transaction. Blockchain transactions are still in the process of being indexed";
        } else {
            errmsg = "No such mempool or blockchain transaction";
        }
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, errmsg + ". Use gettransaction for wallet transactions.");
    }

    if (verbosity <= 0) {
        return EncodeHexTx(*tx);
    }

    UniValue result(UniValue::VOBJ);
    if (blockindex) {
        LOCK(cs_main);
        result.pushKV("in_active_chain", chainman.ActiveChain().Contains(blockindex));
    }
    // If request is verbosity >= 1 but no blockhash was given, then look up the blockindex
    if (request.params[2].isNull()) {
        LOCK(cs_main);
        blockindex = chainman.m_blockman.LookupBlockIndex(hash_block); // May be nullptr for mempool transactions
    }
    if (verbosity == 1) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }

    CBlockUndo blockUndo;
    CBlock block;

    if (tx->IsCoinBase() || !blockindex || WITH_LOCK(::cs_main, return !(blockindex->nStatus & BLOCK_HAVE_MASK))) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }
    if (!chainman.m_blockman.UndoReadFromDisk(blockUndo, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }
    if (!chainman.m_blockman.ReadBlockFromDisk(block, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Block data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }

    CTxUndo* undoTX {nullptr};
    auto it = std::find_if(block.vtx.begin(), block.vtx.end(), [tx](CTransactionRef t){ return *t == *tx; });
    if (it != block.vtx.end()) {
        // -1 as blockundo does not have coinbase tx
        undoTX = &blockUndo.vtxundo.at(it - block.vtx.begin() - 1);
    }
    TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate(), undoTX, TxVerbosity::SHOW_DETAILS_AND_PREVOUT);
    return result;
},
    };
}